

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RP5C01.cpp
# Opt level: O3

ssize_t __thiscall Ricoh::RP5C01::RP5C01::read(RP5C01 *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  
  uVar9 = __fd & 0xf;
  uVar2 = this->mode_;
  if (1 < (int)uVar2 && uVar9 < 0xd) {
    lVar6 = 0xd;
    if (uVar2 != 3) {
      lVar6 = 0;
    }
    uVar3 = (ulong)(this->ram_)._M_elems[(ulong)uVar9 + lVar6];
    goto switchD_001b11ae_caseD_e;
  }
  uVar8 = uVar2 << 4 | uVar9;
  uVar3 = 0xf;
  switch(uVar8) {
  case 0:
    lVar6 = (long)this->seconds_;
    goto LAB_001b131e;
  case 1:
    iVar5 = this->seconds_;
    iVar1 = (int)((ulong)((long)iVar5 * 0x66666667) >> 0x20);
    iVar5 = iVar5 / 10 + (iVar5 >> 0x1f);
    goto LAB_001b12c1;
  case 2:
    lVar6 = (long)(this->seconds_ / 0x3c);
    goto LAB_001b131e;
  case 3:
    iVar5 = this->seconds_;
    iVar1 = (int)((ulong)((long)iVar5 * 0x1b4e81b5) >> 0x20);
    iVar5 = iVar5 / 600 + (iVar5 >> 0x1f);
LAB_001b12c1:
    iVar5 = iVar5 - (iVar1 >> 0x1f);
    lVar6 = (long)iVar5;
    iVar5 = (iVar5 / 6) * 6;
    goto LAB_001b1337;
  case 4:
  case 5:
    iVar5 = this->seconds_ / 0xe10;
    iVar5 = iVar5 + (((uint)(iVar5 / 6 + (iVar5 >> 0x1f)) >> 2) - (iVar5 >> 0x1f)) * -0x18;
    if (this->twentyfour_hour_clock_ == false) {
      if (iVar5 == 0) {
        iVar5 = 0xc;
      }
      else if (iVar5 == 0xc) {
        iVar5 = 0x1c;
      }
      else {
        uVar2 = (char)iVar5 * 0x2b & 0xffff;
        iVar5 = (uint)(0xc < iVar5) * 0x10 +
                (uint)(byte)((char)iVar5 + ((char)(uVar2 >> 9) + (char)(uVar2 >> 0xf)) * -0xc);
      }
    }
    cVar4 = (char)iVar5;
    bVar7 = (char)((uint)(int)(short)(cVar4 * 0x67) >> 10) - (cVar4 >> 7);
    uVar3 = (ulong)bVar7;
    if (uVar9 == 4) {
      uVar3 = (ulong)(byte)(cVar4 + bVar7 * -10);
    }
    break;
  case 6:
    uVar3 = (ulong)(uint)this->day_of_the_week_;
    break;
  case 7:
    lVar6 = (long)this->day_;
    goto LAB_001b131e;
  case 8:
    lVar6 = (long)this->day_;
    goto LAB_001b1308;
  case 9:
    lVar6 = (long)(this->month_ + 1);
    goto LAB_001b131e;
  case 10:
    lVar6 = (long)(this->month_ + 1);
    goto LAB_001b1308;
  case 0xb:
    lVar6 = (long)this->year_;
    goto LAB_001b131e;
  case 0xc:
    lVar6 = (long)this->year_;
LAB_001b1308:
    iVar5 = (int)((ulong)(lVar6 * 0x66666667) >> 0x20);
    lVar6 = (long)((iVar5 >> 2) - (iVar5 >> 0x1f));
LAB_001b131e:
    iVar5 = (int)((ulong)(lVar6 * 0x66666667) >> 0x20);
    iVar5 = ((iVar5 >> 2) - (iVar5 >> 0x1f)) * 10;
LAB_001b1337:
    uVar3 = (ulong)(uint)((int)lVar6 - iVar5);
    break;
  case 0xd:
  case 0x1d:
  case 0x2d:
    goto switchD_001b11ae_caseD_d;
  case 0xe:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1c:
  case 0x1e:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2e:
    break;
  case 0xf:
  case 0x1f:
  case 0x2f:
switchD_001b11ae_caseD_f:
    uVar3 = (ulong)((this->one_hz_on_ ^ 1) * 8 + (this->sixteen_hz_on_ ^ 1) * 4);
    break;
  case 0x1a:
    uVar3 = (ulong)this->twentyfour_hour_clock_;
    break;
  case 0x1b:
    uVar3 = (ulong)(uint)this->leap_year_;
    break;
  default:
    if (uVar8 != 0x3d) {
      if (uVar8 != 0x3f) break;
      goto switchD_001b11ae_caseD_f;
    }
    goto switchD_001b11ae_caseD_d;
  }
switchD_001b11ae_caseD_e:
  return uVar3 | 0xf0;
switchD_001b11ae_caseD_d:
  uVar3 = (ulong)((uint)this->alarm_enabled_ * 4 + (uint)this->timer_enabled_ * 8 | uVar2);
  goto switchD_001b11ae_caseD_e;
}

Assistant:

uint8_t RP5C01::read(int address) {
	address &= 0xf;

	if(address < 0xd && mode_ >= 2) {
		address += mode_ == 3 ? 13 : 0;
		return 0xf0 | ram_[size_t(address)];
	}

	int value = 0xf;
	switch(Reg(mode_, address)) {
		// Second.
		case Reg(0, 0x00):	value = SecondEncoder::decode<0>(seconds_);	break;
		case Reg(0, 0x01):	value = SecondEncoder::decode<1>(seconds_);	break;

		// Minute.
		case Reg(0, 0x02):	value = SecondEncoder::decode<2>(seconds_);	break;
		case Reg(0, 0x03):	value = SecondEncoder::decode<3>(seconds_);	break;

		// Hour.
		case Reg(0, 0x04):
		case Reg(0, 0x05): {
			int hours = SecondEncoder::decode<4>(seconds_);
			if(!twentyfour_hour_clock_) {
				hours = twenty_four_to_twelve(hours);
			}
			if(address == 0x4) {
				value = TwoDigitEncoder::decode<0>(hours);
			} else {
				value = TwoDigitEncoder::decode<1>(hours);
			}
		} break;

		// Day-of-the-week.
		case Reg(0, 0x06):	value = day_of_the_week_;	break;

		// Day.
		case Reg(0, 0x07):	value = TwoDigitEncoder::decode<0>(day_);		break;
		case Reg(0, 0x08):	value = TwoDigitEncoder::decode<1>(day_);		break;

		// Month.
		case Reg(0, 0x09):	value = TwoDigitEncoder::decode<0>(month_ + 1);	break;
		case Reg(0, 0x0a):	value = TwoDigitEncoder::decode<1>(month_ + 1);	break;

		// Year.
		case Reg(0, 0x0b):	value = TwoDigitEncoder::decode<0>(year_);		break;
		case Reg(0, 0x0c):	value = TwoDigitEncoder::decode<1>(year_);		break;

		// TODO: alarm minutes.
		case Reg(1, 0x02):
		case Reg(1, 0x03):	break;

		// TODO: alarm hours.
		case Reg(1, 0x04):
		case Reg(1, 0x05):	break;

		// TODO: alarm day-of-the-week.
		case Reg(1, 0x06):	break;

		// TODO: alarm day.
		case Reg(1, 0x07):
		case Reg(1, 0x08):	break;

		// 12/24-hour clock.
		case Reg(1, 0x0a):	value = twentyfour_hour_clock_;	break;

		// Leap year.
		case Reg(1, 0x0b):	value = leap_year_;				break;

		//
		// Registers D–F don't depend on the mode.
		//

		case Reg(0, 0xd):	case Reg(1, 0xd):	case Reg(2, 0xd):	case Reg(3, 0xd):
			value =
				(timer_enabled_ ? 0x8 : 0x0) |
				(alarm_enabled_ ? 0x4 : 0x0) |
				mode_;
		break;
		case Reg(0, 0xe):	case Reg(1, 0xe):	case Reg(2, 0xe):	case Reg(3, 0xe):
			// Test register; unclear what is supposed to happen.
		break;
		case Reg(0, 0xf):	case Reg(1, 0xf):	case Reg(2, 0xf):	case Reg(3, 0xf):
			value =
				(one_hz_on_ ? 0x0 : 0x8) |
				(sixteen_hz_on_ ? 0x0 : 0x4);
		break;
	}

	return uint8_t(0xf0 | value);
}